

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O1

void FinishDehPatch(void)

{
  PClassActor *cls;
  AActor *defaults;
  BYTE *pBVar1;
  bool bVar2;
  PClass *this;
  FName *pFVar3;
  ENamedName EVar4;
  int iVar5;
  PClassActor *info;
  FState *key;
  FName *pFVar6;
  Node *pNVar7;
  DObject *p;
  PFunction *pPVar8;
  PClassActor *pPVar9;
  ulong uVar10;
  bool bVar11;
  BYTE *pBVar12;
  AmmoPerAttack *pAVar13;
  ulong uVar14;
  ulong uVar15;
  FStateDefinitions statedef;
  char typeNameBuilder [32];
  FName local_bc;
  BYTE *local_b8;
  FName local_b0;
  FName local_ac;
  undefined1 local_a8 [16];
  FState *local_98;
  FState *pFStack_90;
  intptr_t local_88;
  TArray<FState,_FState> local_80;
  TArray<FScriptPosition,_FScriptPosition> local_70;
  ulong local_60;
  char local_58 [40];
  
  if (TouchedActors.Count != 0) {
    uVar10 = 0;
    uVar14 = 0;
    do {
      cls = TouchedActors.Array[uVar10];
      pBVar12 = (cls->super_PClass).Defaults;
      uVar15 = uVar14;
      if ((pBVar12[0x1bc] & 1) != 0) {
        do {
          local_60 = uVar10;
          local_b8 = pBVar12;
          uVar15 = (ulong)((int)uVar14 + 1);
          mysnprintf(local_58,0x20,"DehackedPickup%d",uVar14);
          this = ADehackedPickup::RegistrationInfo.MyClass;
          local_bc.Index = FName::NameManager::FindName(&FName::NameData,local_58,false);
          info = (PClassActor *)PClass::CreateDerivedClass(this,&local_bc,0x510);
          uVar14 = uVar15;
          pBVar12 = local_b8;
          uVar10 = local_60;
        } while (info == (PClassActor *)0x0);
        defaults = (AActor *)(info->super_PClass).Defaults;
        memcpy(defaults,local_b8,0x4c0);
        local_98 = (FState *)0x0;
        pFStack_90 = (FState *)0x0;
        local_a8._0_8_ = (FStateDefine *)0x0;
        local_a8._8_8_ = (Node *)0x0;
        local_70.Array = (FScriptPosition *)0x0;
        local_70.Most = 0;
        local_70.Count = 0;
        local_80.Array = (FState *)0x0;
        local_80.Most = 0;
        local_80.Count = 0;
        local_88 = -1;
        FStateDefinitions::MakeStateDefines((FStateDefinitions *)local_a8,cls);
        pPVar9 = cls;
        if (cls != (PClassActor *)AInventory::RegistrationInfo.MyClass) {
          do {
            pPVar9 = (PClassActor *)(pPVar9->super_PClass).ParentClass;
            if (pPVar9 == (PClassActor *)AInventory::RegistrationInfo.MyClass) break;
          } while (pPVar9 != (PClassActor *)0x0);
          if (pPVar9 == (PClassActor *)0x0) {
            FStateDefinitions::AddStateDefines
                      ((FStateDefinitions *)local_a8,
                       *(FStateLabels **)
                        &AInventory::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.
                         super_PNamedType.super_PCompoundType.super_PType.Align);
          }
        }
        FStateDefinitions::InstallStates((FStateDefinitions *)local_a8,info,defaults);
        pPVar9 = cls->Replacement;
        cls->Replacement = info;
        info->Replacee = cls;
        if (pPVar9 != (PClassActor *)0x0) {
          info->Replacement = pPVar9;
        }
        DPrintf(3,"%s replaces %s\n",
                FName::NameData.NameArray
                [(info->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.TypeName.
                 Index].Text,
                FName::NameData.NameArray
                [(cls->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.TypeName.
                 Index].Text);
        TArray<FScriptPosition,_FScriptPosition>::~TArray(&local_70);
        TArray<FState,_FState>::~TArray(&local_80);
        TArray<FStateDefine,_FStateDefine>::~TArray((TArray<FStateDefine,_FStateDefine> *)local_a8);
        uVar10 = local_60;
      }
      uVar10 = uVar10 + 1;
      uVar14 = uVar15;
    } while (uVar10 < TouchedActors.Count);
  }
  if (StateMap.Count != 0) {
    StateMap.Count = 0;
  }
  TArray<StateMapper,_StateMapper>::ShrinkToFit(&StateMap);
  if (TouchedActors.Count != 0) {
    TouchedActors.Count = 0;
  }
  TArray<PClassActor_*,_PClassActor_*>::ShrinkToFit(&TouchedActors);
  if (WeaponNames.Count != 0) {
    pBVar12 = (BYTE *)0x0;
    do {
      pBVar1 = (WeaponNames.Array[(long)pBVar12]->super_PClass).Defaults;
      if ((*(uint *)(pBVar1 + 0x1d0) >> 0x1c & 1) == 0) {
        pBVar1[0x4fe] = pBVar1[0x4fe] | 1;
        pBVar1[0x520] = '\0';
        pBVar1[0x521] = '\0';
        pBVar1[0x522] = '\0';
        pBVar1[0x523] = '\0';
        local_98 = (FState *)((ulong)local_98 & 0xffffffff);
        TMap<FState_*,_bool,_THashTraits<FState_*>,_TValueTraits<bool>_>::SetNodeVector
                  ((TMap<FState_*,_bool,_THashTraits<FState_*>,_TValueTraits<bool>_> *)local_a8,1);
        local_ac.Index = 0xa4;
        local_b8 = pBVar12;
        key = PClassActor::FindState(WeaponNames.Array[(long)pBVar12],1,&local_ac,false);
        bVar11 = false;
        do {
          if (key == (FState *)0x0) break;
          pFVar3 = (FName *)local_a8._0_8_ + (ulong)((hash_t)local_98 - 1 & (uint)key) * 6;
          do {
            pFVar6 = pFVar3;
            if ((pFVar6 == (FName *)0x0) || (*(FName **)pFVar6 == (FName *)0x1)) {
              pFVar6 = (FName *)0x0;
              break;
            }
            pFVar3 = *(FName **)pFVar6;
          } while ((FState *)((TArray<FStateDefine,_FStateDefine> *)(pFVar6 + 2))->Array != key);
          if ((pFVar6 == (FName *)0x0) || ((char)*(uint *)(pFVar6 + 4) == '\0')) {
            pNVar7 = TMap<FState_*,_bool,_THashTraits<FState_*>,_TValueTraits<bool>_>::GetNode
                               ((TMap<FState_*,_bool,_THashTraits<FState_*>,_TValueTraits<bool>_> *)
                                local_a8,key);
            (pNVar7->Pair).Value = true;
            if (AmmoPerAttacks[0].func != NAME_None) {
              uVar10 = 1;
              pAVar13 = AmmoPerAttacks;
              EVar4 = AmmoPerAttacks[0].func;
              do {
                if (pAVar13->ptr == (VMFunction *)0x0) {
                  local_b0.Index = EVar4;
                  p = (DObject *)
                      PSymbolTable::FindSymbol
                                (&((AStateProvider::RegistrationInfo.MyClass)->super_PNativeStruct).
                                  super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
                                  Symbols,&local_b0,true);
                  pPVar8 = dyn_cast<PFunction>(p);
                  if (pPVar8 != (PFunction *)0x0) {
                    pAVar13->ptr = ((pPVar8->Variants).Array)->Implementation;
                  }
                }
                if (key->ActionFunc == pAVar13->ptr) {
                  iVar5 = pAVar13->ammocount;
                  if (pAVar13->ammocount < 0) {
                    iVar5 = deh.BFGCells;
                  }
                  *(int *)(pBVar1 + 0x520) = iVar5;
                  bVar11 = true;
                  break;
                }
                pAVar13 = AmmoPerAttacks + uVar10;
                EVar4 = AmmoPerAttacks[uVar10].func;
                uVar10 = (ulong)((int)uVar10 + 1);
              } while (EVar4 != NAME_None);
            }
            if (bVar11) goto LAB_003605f4;
            key = key->NextState;
            bVar2 = true;
          }
          else {
LAB_003605f4:
            bVar2 = false;
          }
        } while (bVar2);
        M_Free((void *)local_a8._0_8_);
        pBVar12 = local_b8;
      }
      else {
        *(uint *)(pBVar1 + 0x1d0) = *(uint *)(pBVar1 + 0x1d0) & 0xefffffff;
      }
      pBVar12 = pBVar12 + 1;
    } while (pBVar12 < (BYTE *)(ulong)WeaponNames.Count);
    if (WeaponNames.Count != 0) {
      WeaponNames.Count = 0;
    }
  }
  TArray<PClassActor_*,_PClassActor_*>::ShrinkToFit(&WeaponNames);
  return;
}

Assistant:

void FinishDehPatch ()
{
	unsigned int touchedIndex;
	unsigned int nameindex = 0;

	for (touchedIndex = 0; touchedIndex < TouchedActors.Size(); ++touchedIndex)
	{
		PClassActor *subclass;
		PClassActor *type = TouchedActors[touchedIndex];
		AActor *defaults1 = GetDefaultByType (type);
		if (!(defaults1->flags & MF_SPECIAL))
		{ // We only need to do this for pickups
			continue;
		}

		// Create a new class that will serve as the actual pickup
		char typeNameBuilder[32];
		// 
		do
		{
			// Retry until we find a free name. This is unlikely to happen but not impossible.
			mysnprintf(typeNameBuilder, countof(typeNameBuilder), "DehackedPickup%d", nameindex++);
			subclass = static_cast<PClassActor *>(RUNTIME_CLASS(ADehackedPickup)->
				CreateDerivedClass(typeNameBuilder, sizeof(ADehackedPickup)));
		} 
		while (subclass == nullptr);
		
		AActor *defaults2 = GetDefaultByType (subclass);
		memcpy ((void *)defaults2, (void *)defaults1, sizeof(AActor));

		// Make a copy of the replaced class's state labels 
		FStateDefinitions statedef;
		statedef.MakeStateDefines(type);

		if (!type->IsDescendantOf(RUNTIME_CLASS(AInventory)))
		{
			// If this is a hacked non-inventory item we must also copy AInventory's special states
			statedef.AddStateDefines(RUNTIME_CLASS(AInventory)->StateList);
		}
		statedef.InstallStates(subclass, defaults2);

		// Use the DECORATE replacement feature to redirect all spawns
		// of the original class to the new one.
		PClassActor *old_replacement = type->Replacement;

		type->Replacement = subclass;
		subclass->Replacee = type;
		// If this actor was already replaced by another actor, copy that
		// replacement over to this item.
		if (old_replacement != NULL)
		{
			subclass->Replacement = old_replacement;
		}

		DPrintf (DMSG_NOTIFY, "%s replaces %s\n", subclass->TypeName.GetChars(), type->TypeName.GetChars());
	}

	// Now that all Dehacked patches have been processed, it's okay to free StateMap.
	StateMap.Clear();
	StateMap.ShrinkToFit();
	TouchedActors.Clear();
	TouchedActors.ShrinkToFit();

	// Now it gets nasty: We have to fiddle around with the weapons' ammo use info to make Doom's original
	// ammo consumption work as intended.

	for(unsigned i = 0; i < WeaponNames.Size(); i++)
	{
		AWeapon *weap = (AWeapon*)GetDefaultByType(WeaponNames[i]);
		bool found = false;
		if (weap->flags6 & MF6_INTRYMOVE)
		{
			// Weapon sets an explicit amount of ammo to use so we won't need any special processing here
			weap->flags6 &= ~MF6_INTRYMOVE;
		}
		else
		{
			weap->WeaponFlags |= WIF_DEHAMMO;
			weap->AmmoUse1 = 0;
			// to allow proper checks in CheckAmmo we have to find the first attack pointer in the Fire sequence
			// and set its default ammo use as the weapon's AmmoUse1.

			TMap<FState*, bool> StateVisited;

			FState *state = WeaponNames[i]->FindState(NAME_Fire);
			while (state != NULL)
			{
				bool *check = StateVisited.CheckKey(state);
				if (check != NULL && *check)
				{
					break;	// State has already been checked so we reached a loop
				}
				StateVisited[state] = true;
				for(unsigned j = 0; AmmoPerAttacks[j].func != NAME_None; j++)
				{
					if (AmmoPerAttacks[j].ptr == nullptr)
					{
						auto p = dyn_cast<PFunction>(RUNTIME_CLASS(AStateProvider)->Symbols.FindSymbol(AmmoPerAttacks[j].func, true));
						if (p != nullptr) AmmoPerAttacks[j].ptr = p->Variants[0].Implementation;
					}
					if (state->ActionFunc == AmmoPerAttacks[j].ptr)
					{
						found = true;
						int use = AmmoPerAttacks[j].ammocount;
						if (use < 0) use = deh.BFGCells;
						weap->AmmoUse1 = use;
						break;
					}
				}
				if (found) break;
				state = state->GetNextState();
			}
		}
	}
	WeaponNames.Clear();
	WeaponNames.ShrinkToFit();
}